

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaOf.c
# Opt level: O2

void Of_ManComputeForward2(Of_Man_t *p)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  Gia_Obj_t *pObj;
  int *pCutSet;
  int *piVar7;
  Of_Obj_t *pOVar8;
  int *extraout_RDX;
  int *extraout_RDX_00;
  int *extraout_RDX_01;
  int *extraout_RDX_02;
  int iVar9;
  uint *pCut;
  uint *pCut_00;
  long lVar10;
  uint uVar11;
  int iVar12;
  
  lVar10 = 0;
  while( true ) {
    if (p->pGia->nObjs <= lVar10) {
      return;
    }
    iVar6 = (int)lVar10;
    pObj = Gia_ManObj(p->pGia,iVar6);
    if (pObj == (Gia_Obj_t *)0x0) break;
    uVar11 = (uint)*(undefined8 *)pObj;
    if ((~uVar11 & 0x1fffffff) != 0 && -1 < (int)uVar11) {
      iVar2 = Gia_ObjIsBuf(pObj);
      if (iVar2 == 0) {
        iVar2 = p->pObjs[lVar10].Required;
        pCutSet = Of_ObjCutSet(p,iVar6);
        iVar12 = 0;
        iVar3 = 0;
        piVar7 = extraout_RDX;
        if (p->pObjs[lVar10].nRefs != 0) {
          piVar7 = Of_ObjCutBestP(p,iVar6);
          iVar3 = Of_CutDeref_rec(p,piVar7);
          piVar7 = extraout_RDX_00;
        }
        pCut_00 = (uint *)(pCutSet + 1);
        iVar9 = 1000000000;
        pCut = (uint *)0x0;
        for (; iVar12 < *pCutSet; iVar12 = iVar12 + 1) {
          iVar4 = Of_ManComputeForwardCut(p,(int)pCut_00,piVar7);
          piVar7 = extraout_RDX_01;
          if (iVar4 <= iVar2) {
            iVar5 = Of_CutAreaDerefed2(p,(int *)pCut_00);
            iVar4 = iVar9;
            if (iVar5 <= iVar9) {
              iVar4 = iVar5;
            }
            bVar1 = iVar5 < iVar9;
            piVar7 = extraout_RDX_02;
            iVar9 = iVar4;
            if (bVar1) {
              pCut = pCut_00;
            }
          }
          pCut_00 = pCut_00 + (ulong)(*pCut_00 & 0x1f) + 4;
        }
        if (pCut == (uint *)0x0) {
          __assert_fail("pCutMin != NULL",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                        ,0x45c,"void Of_ManComputeForwardObj2(Of_Man_t *, int)");
        }
        Of_ObjSetCutBestP(p,pCutSet,iVar6,(int *)pCut);
        if (p->pObjs[lVar10].nRefs == 0) {
          iVar6 = 0;
        }
        else {
          iVar6 = Of_CutRef_rec(p,(int *)pCut);
        }
        if (iVar3 < iVar6) {
          __assert_fail("AreaAft <= AreaBef",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                        ,0x460,"void Of_ManComputeForwardObj2(Of_Man_t *, int)");
        }
        uVar11 = pCut[(ulong)(*pCut & 0x1f) + 1];
        if (iVar2 < (int)uVar11) {
          __assert_fail("Delay <= Required",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/gia/giaOf.c"
                        ,0x462,"void Of_ManComputeForwardObj2(Of_Man_t *, int)");
        }
        pOVar8 = p->pObjs;
      }
      else {
        pOVar8 = p->pObjs;
        uVar11 = pOVar8[(int)(iVar6 - (uVar11 & 0x1fffffff))].Delay1;
      }
      pOVar8[lVar10].Delay1 = uVar11;
    }
    lVar10 = lVar10 + 1;
  }
  return;
}

Assistant:

void Of_ManComputeForward2( Of_Man_t * p )
{
    Gia_Obj_t * pObj; int i;
    Gia_ManForEachAnd( p->pGia, pObj, i )
        if ( Gia_ObjIsBuf(pObj) )
            Of_ObjSetDelay1( p, i, Of_ObjDelay1(p, Gia_ObjFaninId0(pObj, i)) );
        else
            Of_ManComputeForwardObj2( p, i );
}